

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O1

void __thiscall DIS::AggregateStatePdu::AggregateStatePdu(AggregateStatePdu *this)

{
  EntityManagementFamilyPdu::EntityManagementFamilyPdu(&this->super_EntityManagementFamilyPdu);
  (this->super_EntityManagementFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__AggregateStatePdu_0019f3c8;
  EntityID::EntityID(&this->_aggregateID);
  this->_forceID = '\0';
  this->_aggregateState = '\0';
  EntityType::EntityType(&this->_aggregateType);
  this->_formation = 0;
  AggregateMarking::AggregateMarking(&this->_aggregateMarking);
  Vector3Float::Vector3Float(&this->_dimensions);
  Orientation::Orientation(&this->_orientation);
  Vector3Double::Vector3Double(&this->_centerOfMass);
  Vector3Float::Vector3Float(&this->_velocity);
  (this->_variableDatumList).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_variableDatumList).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_variableDatumList).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_numberOfDisAggregates = 0;
  this->_numberOfDisEntities = 0;
  this->_numberOfSilentAggregateTypes = 0;
  this->_numberOfSilentEntityTypes = 0;
  (this->_aggregateIDList).super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_aggregateIDList).super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_aggregateIDList).super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->_silentAggregateSystemList).
  super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_silentAggregateSystemList).
  super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_silentAggregateSystemList).
  super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_silentEntitySystemList).
  super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_silentEntitySystemList).
  super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_silentEntitySystemList).
  super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_numberOfVariableDatumRecords = 0;
  Pdu::setPduType((Pdu *)this,'!');
  return;
}

Assistant:

AggregateStatePdu::AggregateStatePdu() : EntityManagementFamilyPdu(),
   _aggregateID(), 
   _forceID(0), 
   _aggregateState(0), 
   _aggregateType(), 
   _formation(0), 
   _aggregateMarking(), 
   _dimensions(), 
   _orientation(), 
   _centerOfMass(), 
   _velocity(), 
   _numberOfDisAggregates(0), 
   _numberOfDisEntities(0), 
   _numberOfSilentAggregateTypes(0), 
   _numberOfSilentEntityTypes(0), 
   _pad2(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 33 );
}